

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O0

ExprBase *
anon_unknown.dwarf_e7629::EvaluateExpression
          (ExpressionContext *ctx,SynBase *source,ExprBase *expression)

{
  StackFrame *this;
  ExprBase *pEVar1;
  size_t sVar2;
  ErrorInfo *this_00;
  char *codeStart;
  int local_2e0;
  ExpressionContext *local_2d8;
  char *code;
  char *local_2c0;
  char *messageEnd;
  char *messageStart;
  ExprBase *result;
  undefined1 local_298 [8];
  ExpressionEvalContext evalCtx;
  ExprBase *expression_local;
  SynBase *source_local;
  ExpressionContext *ctx_local;
  
  evalCtx._624_8_ = expression;
  ExpressionEvalContext::ExpressionEvalContext
            ((ExpressionEvalContext *)local_298,ctx,ctx->allocator);
  if ((ctx->errorBuf != (char *)0x0) && (ctx->errorBufSize != 0)) {
    if (ctx->errorBufLocation == (char *)0x0) {
      local_2d8 = (ExpressionContext *)ctx->errorBuf;
    }
    else {
      local_2d8 = (ExpressionContext *)ctx->errorBufLocation;
    }
    evalCtx.ctx = local_2d8;
    if (ctx->errorBufLocation == (char *)0x0) {
      local_2e0 = 0;
    }
    else {
      local_2e0 = (int)ctx->errorBufLocation - (int)ctx->errorBuf;
    }
    evalCtx.errorBuf._0_4_ = ctx->errorBufSize - local_2e0;
  }
  this = ExpressionContext::get<ExpressionEvalContext::StackFrame>(ctx);
  ExpressionEvalContext::StackFrame::StackFrame(this,ctx->allocator,(FunctionData *)0x0);
  evalCtx._16_8_ = this;
  SmallArray<ExpressionEvalContext::StackFrame_*,_32U>::push_back
            ((SmallArray<ExpressionEvalContext::StackFrame_*,_32U> *)&evalCtx.globalFrame,
             (StackFrame **)&evalCtx.errorBufSize);
  pEVar1 = Evaluate((ExpressionEvalContext *)local_298,(ExprBase *)evalCtx._624_8_);
  messageStart = (char *)pEVar1;
  if ((evalCtx.errorBuf._4_1_ & 1) == 0) {
    if (((pEVar1 == (ExprBase *)0x0) && (ctx->errorBuf != (char *)0x0)) && (ctx->errorBufSize != 0))
    {
      *(undefined1 *)&(evalCtx.ctx)->optimizationLevel = 0;
    }
    ExpressionEvalContext::~ExpressionEvalContext((ExpressionEvalContext *)local_298);
    return pEVar1;
  }
  if ((ctx->errorBuf != (char *)0x0) && (ctx->errorBufSize != 0)) {
    if (ctx->errorCount == 0) {
      ctx->errorPos = (source->pos).begin;
      ctx->errorBufLocation = ctx->errorBuf;
    }
    messageEnd = ctx->errorBufLocation;
    sVar2 = strlen(ctx->errorBufLocation);
    ctx->errorBufLocation = ctx->errorBufLocation + sVar2;
    local_2c0 = ctx->errorBufLocation;
    this_00 = ExpressionContext::get<ErrorInfo>(ctx);
    ErrorInfo::ErrorInfo
              (this_00,ctx->allocator,messageEnd,local_2c0,source->begin,source->end,ctx->errorPos);
    code = (char *)this_00;
    SmallArray<ErrorInfo_*,_4U>::push_back(&ctx->errorInfo,(ErrorInfo **)&code);
    codeStart = FindModuleCodeWithSourceLocation(ctx,ctx->errorPos);
    if (codeStart != (char *)0x0) {
      AddErrorLocationInfo
                (codeStart,ctx->errorPos,ctx->errorBufLocation,
                 ctx->errorBufSize + (*(int *)&ctx->errorBuf - (int)ctx->errorBufLocation));
      sVar2 = strlen(ctx->errorBufLocation);
      ctx->errorBufLocation = ctx->errorBufLocation + sVar2;
    }
  }
  longjmp((__jmp_buf_tag *)ctx->errorHandler,1);
}

Assistant:

ExprBase* EvaluateExpression(ExpressionContext &ctx, SynBase *source, ExprBase *expression)
	{
		ExpressionEvalContext evalCtx(ctx, ctx.allocator);

		if(ctx.errorBuf && ctx.errorBufSize)
		{
			evalCtx.errorBuf = ctx.errorBufLocation ? ctx.errorBufLocation : ctx.errorBuf;
			evalCtx.errorBufSize = ctx.errorBufSize - (ctx.errorBufLocation ? unsigned(ctx.errorBufLocation - ctx.errorBuf) : 0);
		}

		evalCtx.globalFrame = new (ctx.get<ExpressionEvalContext::StackFrame>()) ExpressionEvalContext::StackFrame(ctx.allocator, NULL);
		evalCtx.stackFrames.push_back(evalCtx.globalFrame);

		ExprBase *result = Evaluate(evalCtx, expression);

		if(evalCtx.errorCritical)
		{
			if(ctx.errorBuf && ctx.errorBufSize)
			{
				if(ctx.errorCount == 0)
				{
					ctx.errorPos = source->pos.begin;
					ctx.errorBufLocation = ctx.errorBuf;
				}

				const char *messageStart = ctx.errorBufLocation;

				ctx.errorBufLocation += strlen(ctx.errorBufLocation);

				const char *messageEnd = ctx.errorBufLocation;

				ctx.errorInfo.push_back(new (ctx.get<ErrorInfo>()) ErrorInfo(ctx.allocator, messageStart, messageEnd, source->begin, source->end, ctx.errorPos));

				if(const char *code = FindModuleCodeWithSourceLocation(ctx, ctx.errorPos))
				{
					AddErrorLocationInfo(code, ctx.errorPos, ctx.errorBufLocation, ctx.errorBufSize - unsigned(ctx.errorBufLocation - ctx.errorBuf));

					ctx.errorBufLocation += strlen(ctx.errorBufLocation);
				}
			}

			longjmp(ctx.errorHandler, 1);
		}
		else if(!result)
		{
			// Remove non-critical error from buffer
			if(ctx.errorBuf && ctx.errorBufSize)
				*evalCtx.errorBuf = 0;
		}

		return result;
	}